

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Position::CaptureMaterial(Position *this,Position *position,Square *captureSquare)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Piece *pPiece;
  Piece *pCaptured;
  Square *captureSquare_local;
  Position *position_local;
  Position *this_local;
  
  pPiece = BoardBase::Get((BoardBase *)&this->m_Board,captureSquare);
  iVar2 = GetScore(position);
  iVar3 = (**pPiece->_vptr_Piece)();
  iVar4 = GetColorBias(this);
  this->m_nMaterialScore = iVar2 + iVar3 * iVar4;
  if (pPiece != &None.super_Piece) {
    Material::CaptureMaterial(&this->m_Material,pPiece);
    this->m_nPlySinceCaptureOrPawnMove = 1;
  }
  bVar1 = Square::operator==(captureSquare,&A1);
  if (bVar1) {
    this->m_bVirginA1 = false;
  }
  bVar1 = Square::operator==(captureSquare,&A8);
  if (bVar1) {
    this->m_bVirginA8 = false;
  }
  bVar1 = Square::operator==(captureSquare,&H1);
  if (bVar1) {
    this->m_bVirginH1 = false;
  }
  bVar1 = Square::operator==(captureSquare,&H8);
  if (bVar1) {
    this->m_bVirginH8 = false;
  }
  return;
}

Assistant:

void CaptureMaterial( const Position &position, const Square &captureSquare )
    {
        const Piece *pCaptured = m_Board.Get( captureSquare );
        m_nMaterialScore = position.GetScore() +
                           pCaptured->PieceValue() * GetColorBias();

        if ( pCaptured != &None )
        {
            m_Material.CaptureMaterial( pCaptured );
            m_nPlySinceCaptureOrPawnMove = 1;
        }

        if ( captureSquare == A1 )
            m_bVirginA1 = false;

        if ( captureSquare == A8 )
            m_bVirginA8 = false;

        if ( captureSquare == H1 )
            m_bVirginH1 = false;

        if ( captureSquare == H8 )
            m_bVirginH8 = false;
    }